

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnElemSegmentElemExpr_RefNull
          (BinaryReaderIR *this,Index segment_index,Type type)

{
  pointer ppEVar1;
  char *__s;
  Offset OVar2;
  ElemSegment *pEVar3;
  Expr *pEVar4;
  _func_int ***ppp_Var5;
  Expr *node_p;
  size_t sVar6;
  intrusive_list<wabt::Expr> local_40;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U != (ulong)segment_index) {
    __assert_fail("segment_index == module_->elem_segments.size() - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                  ,0x519,
                  "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefNull(Index, Type)"
                 );
  }
  __s = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  pEVar3 = ppEVar1[segment_index];
  sVar6 = strlen(__s);
  local_40.first_ = (Expr *)operator_new(0x48);
  ((local_40.first_)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  ((local_40.first_)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  ((local_40.first_)->loc).filename._M_len = sVar6;
  ((local_40.first_)->loc).filename._M_str = __s;
  ((local_40.first_)->loc).field_1.field_1.offset = OVar2;
  ((local_40.first_)->loc).field_1.field_0.last_column = 0;
  (local_40.first_)->type_ = RefNull;
  (local_40.first_)->_vptr_Expr = (_func_int **)&PTR__Expr_0019aa90;
  *(Type *)&(local_40.first_)->field_0x3c = type;
  local_40.size_ = 1;
  local_40.last_ = local_40.first_;
  std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>::
  emplace_back<wabt::intrusive_list<wabt::Expr>>
            ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
              *)&pEVar3->elem_exprs,&local_40);
  pEVar4 = local_40.first_;
  while (pEVar4 != (Expr *)0x0) {
    ppp_Var5 = &pEVar4->_vptr_Expr;
    pEVar4 = (pEVar4->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var5)[1])();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefNull(Index segment_index,
                                                     Type type) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  Location loc = GetLocation();
  ExprList init_expr;
  init_expr.push_back(std::make_unique<RefNullExpr>(type, loc));
  segment->elem_exprs.push_back(std::move(init_expr));
  return Result::Ok;
}